

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tmove(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  lua_Integer n;
  lua_Integer lVar3;
  int arg;
  long lVar4;
  
  lVar2 = luaL_checkinteger(L,2);
  n = luaL_checkinteger(L,3);
  lVar3 = luaL_checkinteger(L,4);
  iVar1 = lua_type(L,5);
  arg = (uint)(0 < iVar1) * 4 + 1;
  checktab(L,1,1);
  checktab(L,arg,2);
  if (n < lVar2) goto LAB_0013b8f8;
  if (lVar2 + 0x7fffffffffffffff <= n && lVar2 < 1) {
    luaL_argerror(L,3,"too many elements to move");
  }
  if (0x7fffffffffffffff - (n - lVar2) < lVar3) {
    luaL_argerror(L,4,"destination wrap around");
  }
  if ((lVar3 - lVar2 == 0 || lVar3 < lVar2) || n < lVar3) {
LAB_0013b9cc:
    for (lVar4 = 0; lVar4 <= n - lVar2; lVar4 = lVar4 + 1) {
      lua_geti(L,1,lVar2 + lVar4);
      lua_seti(L,arg,lVar3 + lVar4);
    }
  }
  else {
    if (0 < iVar1) {
      iVar1 = lua_compare(L,1,5,0);
      if (iVar1 == 0) goto LAB_0013b9cc;
    }
    for (; -1 < n - lVar2; n = n + -1) {
      lua_geti(L,1,n);
      lua_seti(L,arg,(lVar3 - lVar2) + n);
    }
  }
LAB_0013b8f8:
  lua_pushvalue(L,arg);
  return 1;
}

Assistant:

static int tmove (lua_State *L) {
  lua_Integer f = luaL_checkinteger(L, 2);
  lua_Integer e = luaL_checkinteger(L, 3);
  lua_Integer t = luaL_checkinteger(L, 4);
  int tt = !lua_isnoneornil(L, 5) ? 5 : 1;  /* destination table */
  checktab(L, 1, TAB_R);
  checktab(L, tt, TAB_W);
  if (e >= f) {  /* otherwise, nothing to move */
    lua_Integer n, i;
    luaL_argcheck(L, f > 0 || e < LUA_MAXINTEGER + f, 3,
                  "too many elements to move");
    n = e - f + 1;  /* number of elements to move */
    luaL_argcheck(L, t <= LUA_MAXINTEGER - n + 1, 4,
                  "destination wrap around");
    if (t > e || t <= f || (tt != 1 && !lua_compare(L, 1, tt, LUA_OPEQ))) {
      for (i = 0; i < n; i++) {
        lua_geti(L, 1, f + i);
        lua_seti(L, tt, t + i);
      }
    }
    else {
      for (i = n - 1; i >= 0; i--) {
        lua_geti(L, 1, f + i);
        lua_seti(L, tt, t + i);
      }
    }
  }
  lua_pushvalue(L, tt);  /* return destination table */
  return 1;
}